

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<CTestResource_Test2DTileXResourceArrays_Test>::CreateTest
          (TestFactoryImpl<CTestResource_Test2DTileXResourceArrays_Test> *this)

{
  Test *this_00;
  undefined8 local_30;
  TestFactoryImpl<CTestResource_Test2DTileXResourceArrays_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x10);
  local_30 = (Test *)0x0;
  if (this_00 != (Test *)0x0) {
    CTestResource_Test2DTileXResourceArrays_Test::CTestResource_Test2DTileXResourceArrays_Test
              ((CTestResource_Test2DTileXResourceArrays_Test *)this_00);
    local_30 = this_00;
  }
  return local_30;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }